

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnknownHandleManager.cpp
# Opt level: O3

void __thiscall
helics::UnknownHandleManager::clearUnknownsIf
          (UnknownHandleManager *this,
          function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_std::pair<helics::GlobalHandle,_unsigned_short>)>
          *cfunc)

{
  InterfaceType type;
  anon_class_16_2_e720f12a clearCall;
  InterfaceType local_29;
  anon_class_16_2_e720f12a local_28;
  
  local_28.type = &local_29;
  local_29 = PUBLICATION;
  local_28.cfunc = cfunc;
  maperase_if<std::unordered_multimap<std::__cxx11::string,std::pair<helics::GlobalHandle,unsigned_short>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<helics::GlobalHandle,unsigned_short>>>>,helics::UnknownHandleManager::clearUnknownsIf(std::function<bool(std::__cxx11::string_const&,helics::InterfaceType,std::pair<helics::GlobalHandle,unsigned_short>)>const&)::__0>
            ((unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
              *)this,&local_28);
  local_29 = ENDPOINT;
  maperase_if<std::unordered_multimap<std::__cxx11::string,std::pair<helics::GlobalHandle,unsigned_short>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<helics::GlobalHandle,unsigned_short>>>>,helics::UnknownHandleManager::clearUnknownsIf(std::function<bool(std::__cxx11::string_const&,helics::InterfaceType,std::pair<helics::GlobalHandle,unsigned_short>)>const&)::__0>
            ((unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
              *)&this->unknown_endpoints,&local_28);
  local_29 = FILTER;
  maperase_if<std::unordered_multimap<std::__cxx11::string,std::pair<helics::GlobalHandle,unsigned_short>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<helics::GlobalHandle,unsigned_short>>>>,helics::UnknownHandleManager::clearUnknownsIf(std::function<bool(std::__cxx11::string_const&,helics::InterfaceType,std::pair<helics::GlobalHandle,unsigned_short>)>const&)::__0>
            ((unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
              *)&this->unknown_filters,&local_28);
  local_29 = INPUT;
  maperase_if<std::unordered_multimap<std::__cxx11::string,std::pair<helics::GlobalHandle,unsigned_short>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<helics::GlobalHandle,unsigned_short>>>>,helics::UnknownHandleManager::clearUnknownsIf(std::function<bool(std::__cxx11::string_const&,helics::InterfaceType,std::pair<helics::GlobalHandle,unsigned_short>)>const&)::__0>
            ((unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
              *)&this->unknown_inputs,&local_28);
  return;
}

Assistant:

void UnknownHandleManager::clearUnknownsIf(
    const std::function<bool(const std::string& name, InterfaceType, TargetInfo)>& cfunc)
{
    InterfaceType type = InterfaceType::PUBLICATION;
    auto clearCall = [&cfunc, &type](const auto& it) { return cfunc(it.first, type, it.second); };
    maperase_if(unknown_publications, clearCall);
    type = InterfaceType::ENDPOINT;
    maperase_if(unknown_endpoints, clearCall);
    type = InterfaceType::FILTER;
    maperase_if(unknown_filters, clearCall);
    type = InterfaceType::INPUT;
    maperase_if(unknown_inputs, clearCall);
}